

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcHashEntryPpDefine::~CTcHashEntryPpDefine(CTcHashEntryPpDefine *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  *in_RDI = &PTR__CTcHashEntryPpDefine_0043f240;
  if (in_RDI[5] != 0) {
    for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 8); iVar2 = iVar2 + 1) {
      lib_free_str((char *)0x2f0c39);
    }
    free((void *)in_RDI[5]);
    free((void *)in_RDI[6]);
    pvVar1 = (void *)in_RDI[7];
    if (pvVar1 != (void *)0x0) {
      CVmHashTable::~CVmHashTable((CVmHashTable *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
      operator_delete(pvVar1,0x20);
    }
  }
  lib_free_str((char *)0x2f0ca3);
  if (in_RDI[0xb] != in_RDI[9]) {
    lib_free_str((char *)0x2f0cc2);
  }
  CTcHashEntryPp::~CTcHashEntryPp((CTcHashEntryPp *)0x2f0cd0);
  return;
}

Assistant:

CTcHashEntryPpDefine::~CTcHashEntryPpDefine()
{
    int i;
    
    /* delete the argument list */
    if (argv_ != 0)
    {
        /* delete each argument string */
        for (i = 0 ; i < argc_ ; ++i)
            lib_free_str(argv_[i]);

        /* delete the argument vector */
        t3free(argv_);

        /* delete the argument entry list */
        t3free(arg_entry_);

        /* delete the hash table */
        delete params_table_;
    }

    /* delete the expansion */
    lib_free_str(expan_);
    if (orig_expan_ != expan_)
        lib_free_str(orig_expan_);
}